

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O3

u16 u16Deshuffle(u16 w)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ((ushort)(w >> 1 ^ w) & 0x2222) * 3 ^ (uint)w;
  uVar1 = ((uVar1 >> 2 ^ uVar1) & 0xc0c) * 5 ^ uVar1;
  uVar2 = (uVar1 >> 4 ^ uVar1) & 0xf0;
  return ((ushort)(uVar2 << 4) | (ushort)uVar2) ^ (ushort)uVar1;
}

Assistant:

u16 u16Deshuffle(register u16 w)
{
	register u16 t;
	t = (w ^ (w >> 1)) & 0x2222, w ^= t ^ (t << 1);
	t = (w ^ (w >> 2)) & 0x0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 4)) & 0x00F0, w ^= t ^ (t << 4);
	t = 0;
	return w;
}